

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaValidateFacet
              (xmlSchemaTypePtr base,xmlSchemaFacetPtr facet,xmlChar *value,xmlSchemaValPtr val)

{
  xmlSchemaValPtr val_local;
  xmlChar *value_local;
  xmlSchemaFacetPtr facet_local;
  xmlSchemaTypePtr base_local;
  
  if (val == (xmlSchemaValPtr)0x0) {
    if (base == (xmlSchemaTypePtr)0x0) {
      base_local._4_4_ = -1;
    }
    else {
      base_local._4_4_ =
           xmlSchemaValidateFacetInternal
                     (facet,XML_SCHEMA_WHITESPACE_UNKNOWN,base->builtInType,value,
                      (xmlSchemaValPtr)0x0,XML_SCHEMA_WHITESPACE_UNKNOWN);
    }
  }
  else {
    base_local._4_4_ =
         xmlSchemaValidateFacetInternal
                   (facet,XML_SCHEMA_WHITESPACE_UNKNOWN,val->type,value,val,
                    XML_SCHEMA_WHITESPACE_UNKNOWN);
  }
  return base_local._4_4_;
}

Assistant:

int
xmlSchemaValidateFacet(xmlSchemaTypePtr base,
	               xmlSchemaFacetPtr facet,
	               const xmlChar *value,
		       xmlSchemaValPtr val)
{
    /*
    * This tries to ensure API compatibility regarding the old
    * xmlSchemaValidateFacet() and the new xmlSchemaValidateFacetInternal() and
    * xmlSchemaValidateFacetWhtsp().
    */
    if (val != NULL)
	return(xmlSchemaValidateFacetInternal(facet,
	    XML_SCHEMA_WHITESPACE_UNKNOWN, val->type, value, val,
	    XML_SCHEMA_WHITESPACE_UNKNOWN));
    else if (base != NULL)
	return(xmlSchemaValidateFacetInternal(facet,
	    XML_SCHEMA_WHITESPACE_UNKNOWN, base->builtInType, value, val,
	    XML_SCHEMA_WHITESPACE_UNKNOWN));
    return(-1);
}